

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertySetDefinition::IfcPropertySetDefinition
          (IfcPropertySetDefinition *this,void **vtt)

{
  void **vtt_local;
  IfcPropertySetDefinition *this_local;
  
  IfcPropertyDefinition::IfcPropertyDefinition(&this->super_IfcPropertyDefinition,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition,_0UL> *)
             &(this->super_IfcPropertyDefinition).super_IfcRoot.field_0x98,vtt + 10);
  (this->super_IfcPropertyDefinition).super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper = (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcPropertyDefinition).super_IfcRoot.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
            (long)(this->super_IfcPropertyDefinition).super_IfcRoot.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper[-3])
       = vtt[0xc];
  *(void **)&(this->super_IfcPropertyDefinition).super_IfcRoot.field_0x88 = vtt[0xd];
  *(void **)&(this->super_IfcPropertyDefinition).super_IfcRoot.field_0x98 = vtt[0xe];
  return;
}

Assistant:

IfcPropertySetDefinition() : Object("IfcPropertySetDefinition") {}